

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::scarveholes(tetgenmesh *this,int holes,double *holelist)

{
  uint *puVar1;
  arraypool *paVar2;
  shellface ppdVar3;
  undefined8 *puVar4;
  memorypool *pmVar5;
  locateresult lVar6;
  long lVar7;
  point searchpt;
  int iVar8;
  undefined4 in_register_00000034;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  shellface *pppdVar15;
  bool bVar16;
  ulong *local_60;
  long local_58;
  face local_50;
  undefined8 local_40;
  point local_38;
  
  local_40 = CONCAT44(in_register_00000034,holes);
  local_50.shver = 0;
  puVar1 = (uint *)((long)(this->recentsh).sh + (long)this->shmarkindex * 4 + 4);
  *puVar1 = *puVar1 | 2;
  local_38 = holelist;
  arraypool::newindex(this->caveshlist,&local_60);
  *local_60 = (ulong)(this->recentsh).sh;
  *(int *)(local_60 + 1) = (this->recentsh).shver;
  lVar9 = 0;
  pppdVar15 = (shellface *)0x0;
  do {
    paVar2 = this->caveshlist;
    if (paVar2->objects <= lVar9) {
      iVar13 = (int)local_40;
      searchpt = local_38;
      local_50.sh = pppdVar15;
      for (lVar9 = 0; lVar9 < iVar13 * 3; lVar9 = lVar9 + 3) {
        local_50.sh = (this->recentsh).sh;
        local_50.shver = (this->recentsh).shver;
        lVar6 = slocate(this,searchpt,&local_50,1,1,0);
        pppdVar15 = local_50.sh;
        if (lVar6 != OUTSIDE) {
          puVar1 = (uint *)((long)local_50.sh + (long)this->shmarkindex * 4 + 4);
          *puVar1 = *puVar1 | 1;
          arraypool::newindex(this->caveshbdlist,&local_60);
          *local_60 = (ulong)pppdVar15;
          *(int *)(local_60 + 1) = local_50.shver;
        }
        searchpt = searchpt + 3;
      }
      for (local_58 = 0; paVar2 = this->caveshbdlist, local_58 < paVar2->objects;
          local_58 = local_58 + 1) {
        lVar9 = (long)paVar2->objectbytes *
                (long)(int)(paVar2->objectsperblockmark & (uint)local_58);
        local_60 = (ulong *)(paVar2->toparray
                             [(uint)local_58 >> ((byte)paVar2->log2objectsperblock & 0x1f)] + lVar9)
        ;
        lVar9 = *(long *)(paVar2->toparray
                          [(uint)local_58 >> ((byte)paVar2->log2objectsperblock & 0x1f)] + lVar9);
        iVar13 = 0;
        iVar8 = 3;
        while (bVar16 = iVar8 != 0, iVar8 = iVar8 + -1, bVar16) {
          uVar11 = *(ulong *)(lVar9 + (long)(iVar13 >> 1) * 8);
          uVar12 = uVar11 & 0xfffffffffffffff8;
          if (uVar12 != 0) {
            uVar14 = (uint)uVar11;
            if (*(long *)(lVar9 + 0x30 + (long)(iVar13 >> 1) * 8) == 0) {
              uVar10 = *(uint *)(uVar12 + 4 + (long)this->shmarkindex * 4);
              if ((uVar10 & 1) == 0) {
                *(uint *)(uVar12 + 4 + (long)this->shmarkindex * 4) = uVar10 | 1;
                arraypool::newindex(this->caveshbdlist,&local_60);
                *local_60 = uVar12;
                *(uint *)(local_60 + 1) = uVar14 & 7;
              }
            }
            else {
              *(undefined8 *)(uVar12 + (ulong)(uVar14 & 6) * 4) = 0;
            }
          }
          iVar13 = snextpivot[iVar13];
        }
      }
      for (lVar9 = 0; paVar2 = this->caveshlist, lVar9 < paVar2->objects; lVar9 = lVar9 + 1) {
        puVar4 = *(undefined8 **)
                  (paVar2->toparray[(uint)lVar9 >> ((byte)paVar2->log2objectsperblock & 0x1f)] +
                  (long)paVar2->objectbytes * (long)(int)(paVar2->objectsperblockmark & (uint)lVar9)
                  );
        uVar14 = *(uint *)((long)puVar4 + (long)this->shmarkindex * 4 + 4);
        if ((uVar14 & 1) == 0) {
          *(uint *)((long)puVar4 + (long)this->shmarkindex * 4 + 4) = uVar14 & 0xfffffffc;
        }
        else {
          pmVar5 = this->subfaces;
          puVar4[3] = 0;
          *puVar4 = pmVar5->deaditemstack;
          pmVar5->deaditemstack = puVar4;
          pmVar5->items = pmVar5->items + -1;
        }
      }
      paVar2->objects = 0;
      this->caveshbdlist->objects = 0;
      return;
    }
    lVar7 = (long)paVar2->objectbytes * (long)(int)(paVar2->objectsperblockmark & (uint)lVar9);
    local_60 = (ulong *)(paVar2->toparray[(uint)lVar9 >> ((byte)paVar2->log2objectsperblock & 0x1f)]
                        + lVar7);
    pppdVar15 = *(shellface **)
                 (paVar2->toparray[(uint)lVar9 >> ((byte)paVar2->log2objectsperblock & 0x1f)] +
                 lVar7);
    uVar14 = 0;
    iVar13 = 3;
    local_58 = lVar9;
    while (bVar16 = iVar13 != 0, iVar13 = iVar13 + -1, bVar16) {
      ppdVar3 = pppdVar15[(int)uVar14 >> 1];
      uVar11 = (ulong)ppdVar3 & 0xfffffffffffffff8;
      if (uVar11 == 0) {
        if (pppdVar15[(long)((int)uVar14 >> 1) + 6] == (shellface)0x0) {
          uVar10 = *(uint *)((long)pppdVar15 + (long)this->shmarkindex * 4 + 4);
          if ((uVar10 & 1) == 0) {
            *(uint *)((long)pppdVar15 + (long)this->shmarkindex * 4 + 4) = uVar10 | 1;
            arraypool::newindex(this->caveshbdlist,&local_60);
            *local_60 = (ulong)pppdVar15;
            uVar10 = uVar14;
            goto LAB_0012370f;
          }
        }
      }
      else {
        uVar10 = *(uint *)(uVar11 + 4 + (long)this->shmarkindex * 4);
        if ((uVar10 & 2) == 0) {
          *(uint *)(uVar11 + 4 + (long)this->shmarkindex * 4) = uVar10 | 2;
          arraypool::newindex(this->caveshlist,&local_60);
          *local_60 = uVar11;
          uVar10 = (uint)ppdVar3 & 7;
LAB_0012370f:
          *(uint *)(local_60 + 1) = uVar10;
        }
      }
      uVar14 = snextpivot[(int)uVar14];
    }
    lVar9 = local_58 + 1;
  } while( true );
}

Assistant:

void tetgenmesh::scarveholes(int holes, REAL* holelist)
{
  face *parysh, searchsh, neighsh;
  enum locateresult loc;
  int i, j;

  // Get all triangles. Infect unprotected convex hull triangles. 
  smarktest(recentsh);
  caveshlist->newindex((void **) &parysh);
  *parysh = recentsh;
  for (i = 0; i < caveshlist->objects; i++) {
    parysh = (face *) fastlookup(caveshlist, i);
    searchsh = *parysh;
    searchsh.shver = 0;
    for (j = 0; j < 3; j++) {
      spivot(searchsh, neighsh);
      // Is this side on the convex hull?
      if (neighsh.sh != NULL) {
        if (!smarktested(neighsh)) {
          smarktest(neighsh);
          caveshlist->newindex((void **) &parysh);
          *parysh = neighsh;
        }
      } else {
        // A hull side. Check if it is protected by a segment.
        if (!isshsubseg(searchsh)) {
          // Not protected. Save this face.
          if (!sinfected(searchsh)) {
            sinfect(searchsh);
            caveshbdlist->newindex((void **) &parysh);
            *parysh = searchsh;
          }
        }
      }
      senextself(searchsh);
    }
  }

  // Infect the triangles in the holes.
  for (i = 0; i < 3 * holes; i += 3) {
    searchsh = recentsh;
    loc = slocate(&(holelist[i]), &searchsh, 1, 1, 0);
    if (loc != OUTSIDE) {
      sinfect(searchsh);
      caveshbdlist->newindex((void **) &parysh);
      *parysh = searchsh;
    }
  }

  // Find and infect all exterior triangles.
  for (i = 0; i < caveshbdlist->objects; i++) {
    parysh = (face *) fastlookup(caveshbdlist, i);
    searchsh = *parysh;
    searchsh.shver = 0;
    for (j = 0; j < 3; j++) {
      spivot(searchsh, neighsh);
      if (neighsh.sh != NULL) {
        if (!isshsubseg(searchsh)) {
          if (!sinfected(neighsh)) {
            sinfect(neighsh);
            caveshbdlist->newindex((void **) &parysh);
            *parysh = neighsh;
          }
        } else {
          sdissolve(neighsh); // Disconnect a protected face.
        }
      }
      senextself(searchsh);
    }
  }

  // Delete exterior triangles, unmark interior triangles.
  for (i = 0; i < caveshlist->objects; i++) {
    parysh = (face *) fastlookup(caveshlist, i);
    if (sinfected(*parysh)) {
      shellfacedealloc(subfaces, parysh->sh);
    } else {
      sunmarktest(*parysh);
    }
  }

  caveshlist->restart();
  caveshbdlist->restart();
}